

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1173f9::brotli_context::_emit(brotli_context *this,bool is_last,bool force_flush)

{
  bool bVar1;
  size_t out_size;
  uint8_t *output;
  h2o_iovec_t local_18;
  
  bVar1 = brotli::BrotliCompressor::WriteBrotliData
                    (this->brotli_,is_last,force_flush,&out_size,&output);
  if (bVar1) {
    if (out_size != 0) {
      local_18 = h2o_strdup((h2o_mem_pool_t *)0x0,(char *)output,out_size);
      std::vector<st_h2o_iovec_t,_std::allocator<st_h2o_iovec_t>_>::emplace_back<st_h2o_iovec_t>
                (&this->bufs_,&local_18);
    }
    return;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/handler/compress/brotli.cc"
                ,0x4b,"void (anonymous namespace)::brotli_context::_emit(bool, bool)");
}

Assistant:

void brotli_context::_emit(bool is_last, bool force_flush)
{
    uint8_t *output;
    size_t out_size;
    bool ret = brotli_->WriteBrotliData(is_last, force_flush, &out_size, &output);
    assert(ret);
    (void)ret;
    if (out_size != 0)
        bufs_.push_back(h2o_strdup(NULL, reinterpret_cast<const char *>(output), out_size));
}